

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O3

void P_LineOpening_XFloors
               (FLineOpening *open,AActor *thing,line_t *linedef,double x,double y,bool restrict)

{
  sector_t *psVar1;
  F3DFloor *pFVar2;
  secplane_t *psVar3;
  secplane_t *psVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  sector_t *psVar9;
  extsector_t *peVar10;
  double *pdVar11;
  sector_t **ppsVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int local_e0;
  int local_dc;
  double **local_d0;
  sector_t *local_c8;
  double *local_c0;
  double local_b8;
  double dStack_b0;
  double *local_a8;
  FLineOpening *local_a0;
  sector_t **local_98;
  sector_t **local_90;
  extsector_t *local_88;
  double local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  if (thing != (AActor *)0x0) {
    dVar20 = (thing->__Pos).Z;
    dVar18 = thing->Height + dVar20;
    psVar1 = linedef->frontsector;
    psVar9 = linedef->backsector;
    local_88 = psVar9->e;
    if (((psVar1->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) ||
       ((local_88->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0)) {
      local_98 = &linedef->frontsector;
      local_90 = &linedef->backsector;
      local_80 = open->top;
      dVar19 = open->bottom;
      local_b8 = (psVar1->floorplane).negiC *
                 ((psVar1->floorplane).normal.Y * y +
                 (psVar1->floorplane).D + (psVar1->floorplane).normal.X * x);
      dStack_b0 = (psVar9->floorplane).negiC *
                  ((psVar9->floorplane).normal.Y * y +
                  (psVar9->floorplane).D + (psVar9->floorplane).normal.X * x);
      local_d0 = &local_a8;
      local_a8 = (double *)0x0;
      local_c8 = (sector_t *)0x0;
      local_c0 = (double *)0x0;
      iVar8 = -1;
      pdVar11 = &local_b8;
      psVar9 = (sector_t *)0x0;
      local_dc = -1;
      local_e0 = -1;
      peVar10 = psVar1->e;
      dVar14 = x;
      dVar15 = y;
      local_a0 = open;
      local_78 = dVar20;
      dStack_70 = dVar18;
      local_68 = x;
      dStack_60 = x;
      local_58 = y;
      dStack_50 = y;
      bVar7 = true;
      do {
        bVar6 = bVar7;
        if ((peVar10->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
          ppsVar12 = local_90;
          if (bVar6) {
            ppsVar12 = local_98;
          }
          uVar13 = 0;
          do {
            pFVar2 = (peVar10->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar13];
            if ((~pFVar2->flags & 3) == 0) {
              psVar3 = (pFVar2->bottom).plane;
              psVar4 = (pFVar2->top).plane;
              dVar17 = psVar3->negiC * ((psVar3->normal).Y * y + psVar3->D + (psVar3->normal).X * x)
              ;
              local_48 = psVar4->negiC *
                         ((psVar4->normal).Y * dVar15 + psVar4->D + (psVar4->normal).X * dVar14);
              dVar16 = (dVar17 + local_48) * 0.5;
              dVar5 = ABS(dVar20 - dVar16);
              dVar16 = ABS(dVar18 - dVar16);
              if ((dVar17 < local_80) && (dVar16 < dVar5)) {
                local_dc = ((pFVar2->bottom).texture)->texnum;
                local_c8 = *ppsVar12;
                local_80 = dVar17;
              }
              if (((dVar19 < local_48) && (dVar5 <= dVar16)) &&
                 ((!restrict || (local_48 <= (thing->__Pos).Z)))) {
                local_e0 = ((pFVar2->top).texture)->texnum;
                dStack_40 = local_48;
                iVar8 = sector_t::GetTerrain(pFVar2->model,(pFVar2->top).isceiling);
                dVar15 = dStack_50;
                y = local_58;
                dVar14 = dStack_60;
                x = local_68;
                dVar18 = dStack_70;
                dVar20 = local_78;
                psVar9 = *ppsVar12;
                *local_d0 = (double *)(pFVar2->top).plane;
                dVar19 = local_48;
              }
              if ((*pdVar11 <= local_48 && local_48 != *pdVar11) &&
                 (local_48 <= (thing->__Pos).Z + thing->MaxStepHeight)) {
                *pdVar11 = local_48;
              }
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < (peVar10->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
        }
        local_d0 = &local_c0;
        pdVar11 = &dStack_b0;
        peVar10 = local_88;
        bVar7 = false;
      } while (bVar6);
      if (local_a0->bottom <= dVar19 && dVar19 != local_a0->bottom) {
        local_a0->bottom = dVar19;
        (local_a0->floorpic).texnum = local_e0;
        local_a0->floorterrain = iVar8;
        local_a0->bottomsec = psVar9;
        if (local_a8 != (double *)0x0) {
          dVar20 = local_a8[2];
          (local_a0->frontfloorplane).normal.Z = dVar20;
          dVar18 = *local_a8;
          dVar19 = local_a8[1];
          (local_a0->frontfloorplane).normal.X = dVar18;
          (local_a0->frontfloorplane).normal.Y = dVar19;
          dVar14 = local_a8[4];
          (local_a0->frontfloorplane).D = local_a8[3];
          (local_a0->frontfloorplane).negiC = dVar14;
          if (dVar20 < 0.0) {
            (local_a0->frontfloorplane).normal.X = -dVar18;
            (local_a0->frontfloorplane).normal.Y = -dVar19;
            dVar18 = (local_a0->frontfloorplane).D;
            (local_a0->frontfloorplane).normal.Z = -dVar20;
            (local_a0->frontfloorplane).D = -dVar18;
            (local_a0->frontfloorplane).negiC = -(local_a0->frontfloorplane).negiC;
          }
        }
        if (local_c0 != (double *)0x0) {
          dVar20 = local_c0[2];
          (local_a0->backfloorplane).normal.Z = dVar20;
          dVar18 = *local_c0;
          dVar19 = local_c0[1];
          (local_a0->backfloorplane).normal.X = dVar18;
          (local_a0->backfloorplane).normal.Y = dVar19;
          dVar14 = local_c0[4];
          (local_a0->backfloorplane).D = local_c0[3];
          (local_a0->backfloorplane).negiC = dVar14;
          if (dVar20 < 0.0) {
            (local_a0->backfloorplane).normal.X = -dVar18;
            (local_a0->backfloorplane).normal.Y = -dVar19;
            dVar18 = (local_a0->backfloorplane).D;
            (local_a0->backfloorplane).normal.Z = -dVar20;
            (local_a0->backfloorplane).D = -dVar18;
            (local_a0->backfloorplane).negiC = -(local_a0->backfloorplane).negiC;
          }
        }
      }
      if (local_80 < local_a0->top) {
        local_a0->top = local_80;
        (local_a0->ceilingpic).texnum = local_dc;
        local_a0->topsec = local_c8;
      }
      if (dStack_b0 <= local_b8) {
        local_b8 = dStack_b0;
      }
      local_a0->lowfloor = local_b8;
    }
  }
  return;
}

Assistant:

void P_LineOpening_XFloors (FLineOpening &open, AActor * thing, const line_t *linedef, 
	double x, double y, bool restrict)
{
    if(thing)
    {
		double thingbot, thingtop;
		
		thingbot = thing->Z();
		thingtop = thing->Top();
		

		extsector_t::xfloor *xf[2] = {&linedef->frontsector->e->XFloor, &linedef->backsector->e->XFloor};

		// Check for 3D-floors in the sector (mostly identical to what Legacy does here)
		if(xf[0]->ffloors.Size() || xf[1]->ffloors.Size())
		{
			double    lowestceiling = open.top;
			double    highestfloor = open.bottom;
			double    lowestfloor[2] = {
				linedef->frontsector->floorplane.ZatPoint(x, y), 
				linedef->backsector->floorplane.ZatPoint(x, y) };
			FTextureID highestfloorpic;
			int highestfloorterrain = -1;
			FTextureID lowestceilingpic;
			sector_t *lowestceilingsec = NULL, *highestfloorsec = NULL;
			secplane_t *highestfloorplanes[2] = { NULL, NULL };
			
			highestfloorpic.SetInvalid();
			lowestceilingpic.SetInvalid();
			
			for(int j=0;j<2;j++)
			{
				for(unsigned i=0;i<xf[j]->ffloors.Size();i++)
				{
					F3DFloor *rover = xf[j]->ffloors[i];

					if (!(rover->flags & FF_EXISTS)) continue;
					if (!(rover->flags & FF_SOLID)) continue;
					
					double ff_bottom=rover->bottom.plane->ZatPoint(x, y);
					double ff_top=rover->top.plane->ZatPoint(x, y);
					
					double delta1 = fabs(thingbot - ((ff_bottom + ff_top) / 2));
					double delta2 = fabs(thingtop - ((ff_bottom + ff_top) / 2));
					
					if(ff_bottom < lowestceiling && delta1 > delta2) 
					{
						lowestceiling = ff_bottom;
						lowestceilingpic = *rover->bottom.texture;
						lowestceilingsec = j == 0 ? linedef->frontsector : linedef->backsector;
					}
					
					if(ff_top > highestfloor && delta1 <= delta2 && (!restrict || thing->Z() >= ff_top))
					{
						highestfloor = ff_top;
						highestfloorpic = *rover->top.texture;
						highestfloorterrain = rover->model->GetTerrain(rover->top.isceiling);
						highestfloorsec = j == 0 ? linedef->frontsector : linedef->backsector;
						highestfloorplanes[j] = rover->top.plane;
					}
					if(ff_top > lowestfloor[j] && ff_top <= thing->Z() + thing->MaxStepHeight) lowestfloor[j] = ff_top;
				}
			}
			
			if(highestfloor > open.bottom)
			{
				open.bottom = highestfloor;
				open.floorpic = highestfloorpic;
				open.floorterrain = highestfloorterrain;
				open.bottomsec = highestfloorsec;
				if (highestfloorplanes[0])
				{
					open.frontfloorplane = *highestfloorplanes[0];
					if (open.frontfloorplane.fC() < 0) open.frontfloorplane.FlipVert();
				}
				if (highestfloorplanes[1])
				{
					open.backfloorplane = *highestfloorplanes[1];
					if (open.backfloorplane.fC() < 0) open.backfloorplane.FlipVert();
				}
			}
			
			if(lowestceiling < open.top) 
			{
				open.top = lowestceiling;
				open.ceilingpic = lowestceilingpic;
				open.topsec = lowestceilingsec;
			}
			
			open.lowfloor = MIN(lowestfloor[0], lowestfloor[1]);
		}
    }
}